

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# self_test.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  
  for (lVar3 = 8; lVar1 = std::cout, lVar3 != 0x268; lVar3 = lVar3 + 0x10) {
    *(undefined8 *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
         0x3c;
    *(uint *)(strcmp + *(long *)(lVar1 + -0x18)) =
         *(uint *)(strcmp + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout,
                             *(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar3));
    std::operator<<(poVar2,' ');
    (**(code **)((long)&PTR_anon_var_dwarf_b8b8_0010aac0 + lVar3))();
    std::operator<<((ostream *)&std::cout,"pass\n");
  }
  puts("\ncool!");
  return 0;
}

Assistant:

int main()
{
  struct test {
    const char* name;
    void (*test_func)();
  };
  test tests[] = {
    {
        "== any_of",
        []{
            REQUIRE(zero == any_of(0,1,2));
            REQUIRE(zero == any_of(1,0,3));
            REQUIRE(zero == any_of(1,2,0));
            REQUIRE(!(zero == any_of(1,2,3)));
            REQUIRE(any_of(0,2,3) == zero);
            REQUIRE(any_of(1,0,3) == zero);
            REQUIRE(any_of(1,2,0) == zero);
            REQUIRE(!(any_of(1,2,3) == zero));
        }
    },
    {
        "== all_of",
        []{
            REQUIRE(!(zero == all_of(1,2,3)));
            REQUIRE(!(zero == all_of(0,1,2)));
            REQUIRE(!(zero == all_of(0,1,0)));
            REQUIRE(zero == all_of(0,0,0));
            REQUIRE(zero == all_of(0,0));
            REQUIRE(zero == all_of(0));
            REQUIRE(!(all_of(1,2,3) == zero));
            REQUIRE(!(all_of(0,1,2) == zero));
            REQUIRE(!(all_of(0,1,0) == zero));
            REQUIRE(all_of(0,0,0) == zero);
            REQUIRE(all_of(0,0) == zero);
            REQUIRE(all_of(0) == zero);
        }
    },
    {
      "== none_of",
      []{
          REQUIRE(zero == none_of(1,2,3));
          REQUIRE(zero == none_of(1,2));
          REQUIRE(zero == none_of(1));
          REQUIRE(!(zero == none_of(0,1,2)));
          REQUIRE(!(zero == none_of(1,2,0)));
          REQUIRE(!(zero == none_of(1,0,2)));
          REQUIRE(!(zero == none_of(0,1)));
          REQUIRE(!(zero == none_of(1,0)));
          REQUIRE(!(zero == none_of(0)));
          REQUIRE(zero == none_of(1));
      }
    },
    {
      "!= any_of",
      []{
          REQUIRE(zero != any_of(1,2,3));
          REQUIRE(!(zero != any_of(0,1,2)));
          REQUIRE(!(zero != any_of(1,2,0)));
          REQUIRE(!(zero != any_of(1,0,2)));
          REQUIRE(!(zero != any_of(0,1)));
          REQUIRE(!(zero != any_of(1,0)));
          REQUIRE(!(zero != any_of(0)));
          REQUIRE(zero != any_of(1));
          REQUIRE(any_of(1,2,3) != zero);
          REQUIRE(!(any_of(0,1,2) != zero));
          REQUIRE(!(any_of(1,2,0) != zero));
          REQUIRE(!(any_of(1,0,2) != zero));
          REQUIRE(!(any_of(0,1) != zero));
          REQUIRE(!(any_of(1,0) != zero));
          REQUIRE(!(any_of(0) != zero));
          REQUIRE(any_of(1) != zero);
      }
    },
    {
        "!= all_of",
        [] {
            REQUIRE(zero != all_of(1, 2, 3));
            REQUIRE(zero != all_of(0,1,2));
            REQUIRE(zero != all_of(1,0,2));
            REQUIRE(zero != all_of(1,2,0));
            REQUIRE(zero != all_of(1,2));
            REQUIRE(zero != all_of(0,1));
            REQUIRE(zero != all_of(1,0));
            REQUIRE(zero != all_of(1));
            REQUIRE(!(zero != all_of(0)));
            REQUIRE(!(zero != all_of(0,0)));
            REQUIRE(!(zero != all_of(0,0,0)));
            REQUIRE(all_of(1, 2, 3) != zero);
            REQUIRE(all_of(0,1,2) != zero);
            REQUIRE(all_of(1,0,2) != zero);
            REQUIRE(all_of(1,2,0) != zero);
            REQUIRE(all_of(1,2) != zero);
            REQUIRE(all_of(0,1) != zero);
            REQUIRE(all_of(1,0) != zero);
            REQUIRE(all_of(1) != zero);
            REQUIRE(!(all_of(0) != zero));
            REQUIRE(!(all_of(0,0) != zero));
            REQUIRE(!(all_of(0,0,0) != zero));
        }
    },
    {
        "!= none_of",
        []{
            REQUIRE(!(zero != none_of(1,2,3)));
            REQUIRE(zero != none_of(0,1,2));
            REQUIRE(zero != none_of(1,0,2));
            REQUIRE(zero != none_of(1,2,0));
            REQUIRE(!(zero != none_of(1,2)));
            REQUIRE(zero != none_of(0,1));
            REQUIRE(zero != none_of(1,0));
            REQUIRE(zero != none_of(0));
            REQUIRE(!(zero != none_of(1)));
            REQUIRE(!(none_of(1,2,3) != zero));
            REQUIRE(none_of(0,1,2) != zero);
            REQUIRE(none_of(1,0,2) != zero);
            REQUIRE(none_of(1,2,0) != zero);
            REQUIRE(!(none_of(1,2) != zero));
            REQUIRE(none_of(0,1) != zero);
            REQUIRE(none_of(1,0) != zero);
            REQUIRE(none_of(0) != zero);
            REQUIRE(!(none_of(1) != zero));
        }
    },
    {
        "< any_of",
        []{
            REQUIRE(zero < any_of(0,0,1));
            REQUIRE(zero < any_of(0,1,0));
            REQUIRE(zero < any_of(1,0,0));
            REQUIRE(!(zero < any_of(0,0,0)));
            REQUIRE(zero < any_of(0,1));
            REQUIRE(zero < any_of(1,0));
            REQUIRE(!(zero < any_of(0,0)));
            REQUIRE(zero < any_of(1));
            REQUIRE(!(zero < any_of(0)));
            REQUIRE(any_of(0,0,1) > zero);
            REQUIRE(any_of(0,1,0) > zero);
            REQUIRE(any_of(1,0,0) > zero);
            REQUIRE(!(any_of(0,0,0) > zero));
            REQUIRE(any_of(0,1) > zero);
            REQUIRE(any_of(1,0) > zero);
            REQUIRE(!(any_of(0,0) > zero));
            REQUIRE(any_of(1) > zero);
            REQUIRE(!(any_of(0) > zero));
        }
    },
    {
        "< all_of",
        []{
            REQUIRE(zero < all_of(1,2,3));
            REQUIRE(!(zero < all_of(0,1,2)));
            REQUIRE(!(zero < all_of(1,0,2)));
            REQUIRE(!(zero < all_of(1,2,0)));
            REQUIRE(zero < all_of(1,2));
            REQUIRE(!(zero < all_of(0,1)));
            REQUIRE(!(zero < all_of(1,0)));
            REQUIRE(zero < all_of(1));
            REQUIRE(!(zero < all_of(0)));
            REQUIRE(all_of(1,2,3) > zero);
            REQUIRE(!(all_of(0,1,2) > zero));
            REQUIRE(!(all_of(1,0,2) > zero));
            REQUIRE(!(all_of(1,2,0) > zero));
            REQUIRE(all_of(1,2) > zero);
            REQUIRE(!(all_of(0,1) > zero));
            REQUIRE(!(all_of(1,0) > zero));
            REQUIRE(all_of(1) > zero);
            REQUIRE(!(all_of(0) > zero));
        }
    },
    {
      "< none_of",
      []{
          REQUIRE(zero < none_of(0,0,0));
          REQUIRE(!(zero < none_of(1,0,0)));
          REQUIRE(!(zero < none_of(0,1,0)));
          REQUIRE(!(zero < none_of(0,0,1)));
          REQUIRE(zero < none_of(0,0));
          REQUIRE(!(zero < none_of(1,0)));
          REQUIRE(!(zero < none_of(0,1)));
          REQUIRE(zero < none_of(0));
          REQUIRE(!(zero < none_of(1)));
          REQUIRE(none_of(0,0,0) > zero);
          REQUIRE(!(none_of(1,0,0) > zero));
          REQUIRE(!(none_of(0,1,0) > zero));
          REQUIRE(!(none_of(0,0,1) > zero));
          REQUIRE(none_of(0,0) > zero);
          REQUIRE(!(none_of(1,0) > zero));
          REQUIRE(!(none_of(0,1) > zero));
          REQUIRE(none_of(0) > zero);
          REQUIRE(!(none_of(1) > zero));
      }
    },
    {
        "<= any_of",
        []{
            REQUIRE(!(zero <= any_of(-1,-1,-1)));
            REQUIRE(zero <= any_of(0,-1,-1));
            REQUIRE(zero <= any_of(-1,0,-1));
            REQUIRE(zero <= any_of(-1,-1,0));
            REQUIRE(zero <= any_of(0,-1));
            REQUIRE(zero <= any_of(-1,0));
            REQUIRE(!(zero <= any_of(-1,-1)));
            REQUIRE(zero <= any_of(0));
            REQUIRE(!(zero <= any_of(-1)));
            REQUIRE(!(any_of(-1,-1,-1) >= zero));
            REQUIRE(any_of(0,-1,-1) >= zero);
            REQUIRE(any_of(-1,0,-1) >= zero);
            REQUIRE(any_of(-1,-1,0) >= zero);
            REQUIRE(any_of(0,-1) >= zero);
            REQUIRE(any_of(-1,0) >= zero);
            REQUIRE(!(any_of(-1,-1) >= zero));
            REQUIRE(any_of(0) >= zero);
            REQUIRE(!(any_of(-1) >= zero));
        }
    },
    {
        "<= all_of",
        []{
            REQUIRE(zero <= all_of(0,0,0));
            REQUIRE(!(zero <= all_of(0,-1,-1)));
            REQUIRE(!(zero <= all_of(-1,0,-1)));
            REQUIRE(!(zero <= all_of(-1,-1,0)));
            REQUIRE(zero <= all_of(0,0));
            REQUIRE(!(zero <= all_of(0,-1)));
            REQUIRE(!(zero <= all_of(-1,0)));
            REQUIRE(zero <= all_of(0));
            REQUIRE(!(zero <= all_of(-1)));
            REQUIRE(all_of(0,0,0) >= zero);
            REQUIRE(!(all_of(0,-1,-1) >= zero));
            REQUIRE(!(all_of(-1,0,-1) >= zero));
            REQUIRE(!(all_of(-1,-1,0) >= zero));
            REQUIRE(all_of(0,0) >= zero);
            REQUIRE(!(all_of(0,-1) >= zero));
            REQUIRE(!(all_of(-1,0) >= zero));
            REQUIRE(all_of(0) >= zero);
            REQUIRE(!(all_of(-1) >= zero));
        }
    },
    {
        "<= none_of",
        []{
            REQUIRE(zero <= none_of(-1,-1,-1));
            REQUIRE(!(zero <= none_of(0,-1,-1)));
            REQUIRE(!(zero <= none_of(-1,0,-1)));
            REQUIRE(!(zero <= none_of(-1,-1,0)));
            REQUIRE(zero <= none_of(-1,-1));
            REQUIRE(!(zero <= none_of(-1,0)));
            REQUIRE(!(zero <= none_of(0,-1)));
            REQUIRE(zero <= none_of(-1));
            REQUIRE(!(zero <= none_of(0)));
            REQUIRE(none_of(-1,-1,-1) >= zero);
            REQUIRE(!(none_of(0,-1,-1) >= zero));
            REQUIRE(!(none_of(-1,0,-1) >= zero));
            REQUIRE(!(none_of(-1,-1,0) >= zero));
            REQUIRE(none_of(-1,-1) >= zero);
            REQUIRE(!(none_of(-1,0) >= zero));
            REQUIRE(!(none_of(0,-1) >= zero));
            REQUIRE(none_of(-1) >= zero);
            REQUIRE(!(none_of(0) >= zero));
        }
    },
    ///
    {
        "> any_of",
        []{
            REQUIRE(zero > any_of(0,0,-1));
            REQUIRE(zero > any_of(0,-1,0));
            REQUIRE(zero > any_of(-1,0,0));
            REQUIRE(!(zero > any_of(0,0,0)));
            REQUIRE(zero > any_of(0,-1));
            REQUIRE(zero > any_of(-1,0));
            REQUIRE(!(zero > any_of(0,0)));
            REQUIRE(zero > any_of(-1));
            REQUIRE(!(zero > any_of(0)));
            REQUIRE(any_of(0,0,-1) < zero);
            REQUIRE(any_of(0,-1,0) < zero);
            REQUIRE(any_of(-1,0,0) < zero);
            REQUIRE(!(any_of(0,0,0) < zero));
            REQUIRE(any_of(0,-1) < zero);
            REQUIRE(any_of(-1,0) < zero);
            REQUIRE(!(any_of(0,0) < zero));
            REQUIRE(any_of(-1) < zero);
            REQUIRE(!(any_of(0) < zero));
        }
    },
    {
        "> all_of",
        []{
            REQUIRE(zero > all_of(-1,-2,-3));
            REQUIRE(!(zero > all_of(0,-1,-2)));
            REQUIRE(!(zero > all_of(-1,0,-2)));
            REQUIRE(!(zero > all_of(-1,-2,0)));
            REQUIRE(zero > all_of(-1,-2));
            REQUIRE(!(zero > all_of(0,-1)));
            REQUIRE(!(zero > all_of(-1,0)));
            REQUIRE(zero > all_of(-1));
            REQUIRE(!(zero > all_of(0)));
            REQUIRE(all_of(-1,-2,-3) < zero);
            REQUIRE(!(all_of(0,-1,-2) < zero));
            REQUIRE(!(all_of(-1,0,-2) < zero));
            REQUIRE(!(all_of(-1,-2,0) < zero));
            REQUIRE(all_of(-1,-2) < zero);
            REQUIRE(!(all_of(0,-1) < zero));
            REQUIRE(!(all_of(-1,0) < zero));
            REQUIRE(all_of(-1) < zero);
            REQUIRE(!(all_of(0) < zero));
        }
    },
    {
        "> none_of",
        []{
            REQUIRE(zero > none_of(0,0,0));
            REQUIRE(!(zero > none_of(-1,0,0)));
            REQUIRE(!(zero > none_of(0,-1,0)));
            REQUIRE(!(zero > none_of(0,0,-1)));
            REQUIRE(zero > none_of(0,0));
            REQUIRE(!(zero > none_of(-1,0)));
            REQUIRE(!(zero > none_of(0,-1)));
            REQUIRE(zero > none_of(0));
            REQUIRE(!(zero > none_of(-1)));
            REQUIRE(none_of(0,0,0) < zero);
            REQUIRE(!(none_of(-1,0,0) < zero));
            REQUIRE(!(none_of(0,-1,0) < zero));
            REQUIRE(!(none_of(0,0,-1) < zero));
            REQUIRE(none_of(0,0) < zero);
            REQUIRE(!(none_of(-1,0) < zero));
            REQUIRE(!(none_of(0,-1) < zero));
            REQUIRE(none_of(0) < zero);
            REQUIRE(!(none_of(-1) < zero));
        }
    },
    {
        ">= any_of",
        []{
            REQUIRE(!(zero >= any_of(1,1,1)));
            REQUIRE(zero >= any_of(0,1,1));
            REQUIRE(zero >= any_of(1,0,1));
            REQUIRE(zero >= any_of(1,1,0));
            REQUIRE(zero >= any_of(0,1));
            REQUIRE(zero >= any_of(1,0));
            REQUIRE(!(zero >= any_of(1,1)));
            REQUIRE(zero >= any_of(0));
            REQUIRE(!(zero >= any_of(1)));
            REQUIRE(!(any_of(1,1,1) <= zero));
            REQUIRE(any_of(0,1,1) <= zero);
            REQUIRE(any_of(1,0,1) <= zero);
            REQUIRE(any_of(1,1,0) <= zero);
            REQUIRE(any_of(0,1) <= zero);
            REQUIRE(any_of(1,0) <= zero);
            REQUIRE(!(any_of(1,1) <= zero));
            REQUIRE(any_of(0) <= zero);
            REQUIRE(!(any_of(1) <= zero));
        }
    },
    {
        ">= all_of",
        []{
            REQUIRE(zero >= all_of(0,0,0));
            REQUIRE(!(zero >= all_of(0,1,1)));
            REQUIRE(!(zero >= all_of(1,0,1)));
            REQUIRE(!(zero >= all_of(1,1,0)));
            REQUIRE(zero >= all_of(0,0));
            REQUIRE(!(zero >= all_of(0,1)));
            REQUIRE(!(zero >= all_of(1,0)));
            REQUIRE(zero >= all_of(0));
            REQUIRE(!(zero >= all_of(1)));
            REQUIRE(all_of(0,0,0) <= zero);
            REQUIRE(!(all_of(0,1,1) <= zero));
            REQUIRE(!(all_of(1,0,1) <= zero));
            REQUIRE(!(all_of(1,1,0) <= zero));
            REQUIRE(all_of(0,0) <= zero);
            REQUIRE(!(all_of(0,1) <= zero));
            REQUIRE(!(all_of(1,0) <= zero));
            REQUIRE(all_of(0) <= zero);
            REQUIRE(!(all_of(1) <= zero));
        }
    },
    {
        ">= none_of",
        []{
            REQUIRE(zero >= none_of(1,1,1));
            REQUIRE(!(zero >= none_of(0,1,1)));
            REQUIRE(!(zero >= none_of(1,0,1)));
            REQUIRE(!(zero >= none_of(1,1,0)));
            REQUIRE(zero >= none_of(1,1));
            REQUIRE(!(zero >= none_of(1,0)));
            REQUIRE(!(zero >= none_of(0,1)));
            REQUIRE(zero >= none_of(1));
            REQUIRE(!(zero >= none_of(0)));
            REQUIRE(none_of(1,1,1) <= zero);
            REQUIRE(!(none_of(0,1,1) <= zero));
            REQUIRE(!(none_of(1,0,1) <= zero));
            REQUIRE(!(none_of(1,1,0) <= zero));
            REQUIRE(none_of(1,1) <= zero);
            REQUIRE(!(none_of(1,0) <= zero));
            REQUIRE(!(none_of(0,1) <= zero));
            REQUIRE(none_of(1) <= zero);
            REQUIRE(!(none_of(0) <= zero));
        }
    },
    {
        "any_of(...)",
        []{
            REQUIRE(any_of(negate, next)(1) < 0);
            REQUIRE(!(any_of(negate, next)(zero) < 0));
        }
    },
    {
        "all_of(...)",
        []{
            REQUIRE(all_of(negate, next)(zero) >= 0);
            REQUIRE(all_of(negate, next)(-1) >= 0);
        }
    },
    {
        "none_of(...)",
        []{
            REQUIRE(none_of(negate, next)(zero) < 0);
            REQUIRE(none_of(negate, next)(-1) < 0);
        }
    },
    {
      "print any_of",
      []{
        std::ostringstream os;
        os << any_of{1,3,5};
        auto s = os.str();
        REQUIRE(s == "any_of{1,3,5}");
      }
    },
    {
      "print none_of",
      []{
        std::ostringstream os;
        os << none_of{1,2,3};
        auto s = os.str();
        REQUIRE(s == "none_of{1,2,3}");
      }
    },
    {
      "print all_of",
      []{
        std::ostringstream os;
        os << all_of{1,2,3};
        auto s = os.str();
        REQUIRE(s == "all_of{1,2,3}");
      }
    },
    {
      "all_of is true if all members are true",
      []{
        int v;
        auto b = bool(all_of{true, 1, &v});
        REQUIRE(b);
      }
    },
    {
      "all_of is false with nullptr",
      []{
        auto b = bool(all_of{true, 1, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "all_of is false with int(0)",
      [] {
        int v = 0;
        auto b = bool(all_of{true, v, &v});
        REQUIRE(!b);
      }
    },
    {
      "all_of isfalse with false member",
      [] {
        int v = 1;
        auto b = bool(all_of(false, v, &v));
        REQUIRE(!b);
      }
    },
    {
      "none_of is true if all members are false",
      []{
        int v = 0;
        auto b = bool(none_of{false, v, nullstr});
        REQUIRE(b);
      }
    },
    {
      "none_of is false if a member is a non-nullptr",
      []{
        int v = 0;
        auto b = bool(none_of{false, v, &v});
        REQUIRE(!b);
      }
    },
    {
      "none_of is false if a member is a non-zero int",
      []{
        int v = 1;
        auto b = bool(none_of{false, v, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "none_of is false if a member true",
      []{
        int v = 0;
        auto b = bool(none_of{true, v, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "any_of is false all members are false",
      []{
        int v = 0;
        auto b = bool(any_of{false, v, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "any_of is true if a member is a non-nullptr",
      []{
        int v = 0;
        auto b = bool(any_of{false, v, &v});
        REQUIRE(b);
      }
    },
    {
      "any_of is true if a member is a non-zero int",
      []{
        int v = 1;
        auto b = bool(any_of{false, v, nullstr});
        REQUIRE(b);
      }
    },
    {
      "any_of is true if a member is true",
      []{
        int v = 0;
        auto b = bool(any_of{true, v, nullstr});
        REQUIRE(b);
      }
    },
    {
        "binding an lvalue reference keeps a reference",
        []{
            auto p = std::make_shared<int>(3);
            auto cond = all_of{[](auto&& v) -> bool{ return v.get();}}(p);
            REQUIRE(p.use_count() == 1U);
            REQUIRE(cond);
        }
    },
    {
        "binding an rvalue reference copies an instance",
        []{
            auto cond = all_of{[](auto&& v) { return v.use_count() == 1;}}(std::make_shared<int>(3));
            REQUIRE(cond);
        }

    }

  };
  int failures = 0;
  for (auto& t : tests)
  {
    try {
      std::cout << std::setw(60) << std::left << t.name << ' ';
      t.test_func();
      std::cout << "pass\n";
    }
    catch (const char* m)
    {
      ++failures;
      std::cout << "failed: " << m << '\n';
    }
  }
  if (!failures)
  {
    std::puts("\ncool!");
  }
  else
  {
    std::puts("\nbummer!");
  }
  return failures;
}